

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.hpp
# Opt level: O3

Vector<Indexing::CodeTree::CodeOp> *
Lib::Vector<Indexing::CodeTree::CodeOp>::allocate(size_t length)

{
  Vector<Indexing::CodeTree::CodeOp> *pVVar1;
  ulong uVar2;
  
  uVar2 = length * 0x10 + 0x10;
  if (uVar2 == 0) {
    pVVar1 = (Vector<Indexing::CodeTree::CodeOp> *)
             FixedSizeAllocator<8UL>::alloc
                       ((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR);
  }
  else if (uVar2 < 0x11) {
    pVVar1 = (Vector<Indexing::CodeTree::CodeOp> *)
             FixedSizeAllocator<16UL>::alloc
                       ((FixedSizeAllocator<16UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
  }
  else if (uVar2 < 0x19) {
    pVVar1 = (Vector<Indexing::CodeTree::CodeOp> *)
             FixedSizeAllocator<24UL>::alloc
                       ((FixedSizeAllocator<24UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
  }
  else if (uVar2 < 0x21) {
    pVVar1 = (Vector<Indexing::CodeTree::CodeOp> *)
             FixedSizeAllocator<32UL>::alloc
                       ((FixedSizeAllocator<32UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
  }
  else if (uVar2 < 0x31) {
    pVVar1 = (Vector<Indexing::CodeTree::CodeOp> *)
             FixedSizeAllocator<48UL>::alloc
                       ((FixedSizeAllocator<48UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
  }
  else if (uVar2 < 0x41) {
    pVVar1 = (Vector<Indexing::CodeTree::CodeOp> *)
             FixedSizeAllocator<64UL>::alloc
                       ((FixedSizeAllocator<64UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
  }
  else {
    pVVar1 = (Vector<Indexing::CodeTree::CodeOp> *)::operator_new(uVar2,0x10);
  }
  *(size_t *)pVVar1 = length;
  if (length != 0) {
    memset(pVVar1 + 8,0,length * 0x10);
  }
  return pVVar1;
}

Assistant:

static Vector* allocate(size_t length)
  {
    ASS_G(length,0);

    size_t sz=sizeof(Vector) + (length-1)*sizeof(C);
    Vector* v = reinterpret_cast<Vector*>(ALLOC_KNOWN(sz,"Vector"));
    v->_length = length;
    C* arr = v->_array;
    // in the case C is a class with an initialiser, apply the constructor of it
    // to every element of the allocated array
    array_new<C>(arr,length);
    return v;
  }